

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O2

int drawDisplay(void)

{
  ulong uVar1;
  
  zvgEncSetRGB15(7,7,7);
  zvgFrameVector(0xfffffda8,0x1d7,599,0x1d7);
  zvgFrameVector(599,0x1d7,599,0xfffffe28);
  zvgFrameVector(599,0xfffffe28,0xfffffda8,0xfffffe28);
  zvgFrameVector(0xfffffda8,0xfffffe28,0xfffffda8,0x1d7);
  zvgFrameVector(0xfffffe00,0x17f,0x1ff,0x17f);
  zvgFrameVector(0x1ff,0x17f,0x1ff,0xfffffe80);
  zvgFrameVector(0x1ff,0xfffffe80,0xfffffe00,0xfffffe80);
  zvgFrameVector(0xfffffe00,0xfffffe80,0xfffffe00,0x17f);
  zvgEncSetRGB15(0x1f,0x1f,0x1f);
  zvgFrameVector(0xfffffe70,300,0xfffffea2,300);
  zvgEncSetRGB15(0x1b,0x1b,0x1b);
  zvgFrameVector(0xfffffe70,0x122,0xfffffea2,0x122);
  zvgEncSetRGB15(0x17,0x17,0x17);
  zvgFrameVector(0xfffffe70,0x118,0xfffffea2,0x118);
  zvgEncSetRGB15(0x13,0x13,0x13);
  zvgFrameVector(0xfffffe70,0x10e,0xfffffea2,0x10e);
  zvgEncSetRGB15(0xf,0xf,0xf);
  zvgFrameVector(0xfffffe70,0x104,0xfffffea2,0x104);
  zvgEncSetRGB15(0xb,0xb,0xb);
  zvgFrameVector(0xfffffe70,0xfa,0xfffffea2,0xfa);
  zvgEncSetRGB15(7,7,7);
  zvgFrameVector(0xfffffe70,0xf0,0xfffffea2,0xf0);
  zvgEncSetRGB15(3,3,3);
  zvgFrameVector(0xfffffe70,0xe6,0xfffffea2,0xe6);
  zvgEncSetRGB15(0,0,0);
  zvgFrameVector(0xfffffe70,0xdc,0xfffffea2,0xdc);
  zvgEncSetRGB15(7,7,7);
  for (uVar1 = 0; uVar1 < 0x68; uVar1 = uVar1 + 4) {
    zvgFrameVector(zektorLogo[uVar1] << 4,zektorLogo[uVar1 + 1] << 4,zektorLogo[uVar1 + 2] << 4,
                   zektorLogo[uVar1 + 3] << 4);
  }
  for (uVar1 = 0; uVar1 < 0x68; uVar1 = uVar1 + 4) {
    zvgFrameVector(zektorLogo[uVar1] * 6 + 0x9c,zektorLogo[uVar1 + 1] * 6 + -300,
                   zektorLogo[uVar1 + 2] * 6 + 0x9c,zektorLogo[uVar1 + 3] * 6 + -300);
  }
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 4) {
    zvgFrameVector(dotComLogo[uVar1] * 6 + 0x9c,dotComLogo[uVar1 + 1] * 6 + -300,
                   dotComLogo[uVar1 + 2] * 6 + 0x9c,dotComLogo[uVar1 + 3] * 6 + -300);
  }
  for (uVar1 = 0; uVar1 < 0x68; uVar1 = uVar1 + 4) {
    zvgFrameVector(zektorLogo[uVar1] * 2 + -0x122,zektorLogo[uVar1 + 1] * 2 + 0xc3,
                   zektorLogo[uVar1 + 2] * 2 + -0x122,zektorLogo[uVar1 + 3] * 2 + 0xc3);
  }
  for (uVar1 = 0; uVar1 < 0x68; uVar1 = uVar1 + 4) {
    zvgFrameVector(zektorLogo[uVar1] << 5,zektorLogo[uVar1 + 1] << 5,zektorLogo[uVar1 + 2] << 5,
                   zektorLogo[uVar1 + 3] << 5);
  }
  return 0;
}

Assistant:

int drawDisplay( void)
{
	uint	ii, xStart, yStart, xEnd, yEnd;

	zvgFrameSetRGB15( 7, 7, 7);

	// Draw a full size overscanned box, if setup properly, this will be drawn off the edges
	// of the screen.

	zvgFrameVector( X_MIN_O, Y_MAX_O, X_MAX_O, Y_MAX_O);
	zvgFrameVector( X_MAX_O, Y_MAX_O, X_MAX_O, Y_MIN_O);
	zvgFrameVector( X_MAX_O, Y_MIN_O, X_MIN_O, Y_MIN_O);
	zvgFrameVector( X_MIN_O, Y_MIN_O, X_MIN_O, Y_MAX_O);

	// Draw a box at the edges of the visible screen

	zvgFrameVector( X_MIN, Y_MAX, X_MAX, Y_MAX);
	zvgFrameVector( X_MAX, Y_MAX, X_MAX, Y_MIN);
	zvgFrameVector( X_MAX, Y_MIN, X_MIN, Y_MIN);
	zvgFrameVector( X_MIN, Y_MIN, X_MIN, Y_MAX);

	// Draw some intensity bars

	zvgFrameSetRGB15( 31, 31, 31);
	zvgFrameVector( -400, 300, -350, 300);

	zvgFrameSetRGB15( 27, 27, 27);
	zvgFrameVector( -400, 290, -350, 290);

	zvgFrameSetRGB15( 23, 23, 23);
	zvgFrameVector( -400, 280, -350, 280);

	zvgFrameSetRGB15( 19, 19, 19);
	zvgFrameVector( -400, 270, -350, 270);

	zvgFrameSetRGB15( 15, 15, 15);
	zvgFrameVector( -400, 260, -350, 260);

	zvgFrameSetRGB15( 11, 11, 11);
	zvgFrameVector( -400, 250, -350, 250);

	zvgFrameSetRGB15( 07, 07, 07);
	zvgFrameVector( -400, 240, -350, 240);

	zvgFrameSetRGB15( 03, 03, 03);
	zvgFrameVector( -400, 230, -350, 230);

	zvgFrameSetRGB15( 00, 00, 00);
	zvgFrameVector( -400, 220, -350, 220);

	zvgFrameSetRGB15( 7, 7, 7);

	// place a "normal" size ZEKTOR logo in middle of screen

	for (ii = 0; ii < sizeof( zektorLogo) / sizeof( *zektorLogo); ii += 4)
	{
		// place logo in center of screen, 16x larger than it was drawn.

		xStart =	zektorLogo[ii] * 16;
		yStart =	zektorLogo[ii+1] * 16;
		xEnd = zektorLogo[ii+2] * 16;
		yEnd = zektorLogo[ii+3] * 16;

		// encode vector into command buffer

		zvgFrameVector( xStart, yStart, xEnd, yEnd);
	}

	// place a smaller logo in the lower right corner followed by a .COM

	for (ii = 0; ii < sizeof( zektorLogo) / sizeof( *zektorLogo); ii += 4)
	{
		// draw logo on screen 6x size, and down 300 points and to the right 156 points

		xStart =	zektorLogo[ii] * 6 + 156;
		yStart =	zektorLogo[ii+1] * 6 - 300;
		xEnd = zektorLogo[ii+2] * 6 + 156;
		yEnd = zektorLogo[ii+3] * 6 - 300;

		// encode vector into command buffer

		zvgFrameVector( xStart, yStart, xEnd, yEnd);
	}

	// Add ".com" to above logo

	for (ii = 0; ii < sizeof( dotComLogo) / sizeof( *dotComLogo); ii += 4)
	{
		// draw .com on screen 6x size, and down 300 points and to the right 156 points

		xStart =	dotComLogo[ii] * 6 + 156;
		yStart =	dotComLogo[ii+1] * 6 - 300;
		xEnd = dotComLogo[ii+2] * 6 + 156;
		yEnd = dotComLogo[ii+3] * 6 - 300;

		// encode vector into command buffer

		zvgFrameVector( xStart, yStart, xEnd, yEnd);
	}

	// Draw a small logo in the upper left corner

	for (ii = 0; ii < sizeof( zektorLogo) / sizeof( *zektorLogo); ii += 4)
	{
		// draw on screen 2x size, and up 195 points and to the left 290 points

		xStart =	zektorLogo[ii] * 2 - 290;
		yStart =	zektorLogo[ii+1] * 2 + 195;
		xEnd = zektorLogo[ii+2] * 2 - 290;
		yEnd = zektorLogo[ii+3] * 2 + 195;

		// encode vector into command buffer

		zvgFrameVector( xStart, yStart, xEnd, yEnd);
	}

	// Place real big logo on top of everything.  This logo should go off the edges
	// of a properly sized screen.

	for (ii = 0; ii < sizeof( zektorLogo) / sizeof( *zektorLogo); ii += 4)
	{
		// place logo in center of screen, 32x larger than it was drawn.

		xStart =	zektorLogo[ii] * 32;
		yStart =	zektorLogo[ii+1] * 32;
		xEnd = zektorLogo[ii+2] * 32;
		yEnd = zektorLogo[ii+3] * 32;

		// encode vector into command buffer

		zvgFrameVector( xStart, yStart, xEnd, yEnd);
	}
	return (errOk);
}